

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metrics.cpp
# Opt level: O2

Pass * wasm::createMetricsPass(void)

{
  Metrics *this;
  
  this = (Metrics *)operator_new(0x168);
  Metrics::Metrics(this,false);
  return (Pass *)this;
}

Assistant:

Pass* createMetricsPass() { return new Metrics(false); }